

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_3dPoint * __thiscall
ON_SubDComponentPtr::SubdivisionPoint(ON_3dPoint *__return_storage_ptr__,ON_SubDComponentPtr *this)

{
  ulong uVar1;
  double dVar2;
  uint uVar3;
  
  uVar1 = this->m_ptr;
  uVar3 = (uint)uVar1 & 6;
  switch(uVar3) {
  case 2:
    if ((ON_SubDVertex *)(uVar1 & 0xfffffffffffffff8) != (ON_SubDVertex *)0x0 && uVar3 == 2) {
      ON_SubDVertex::SubdivisionPoint
                (__return_storage_ptr__,(ON_SubDVertex *)(uVar1 & 0xfffffffffffffff8));
      return __return_storage_ptr__;
    }
    break;
  case 4:
    if ((ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8) != (ON_SubDEdge *)0x0 && uVar3 == 4) {
      ON_SubDEdge::SubdivisionPoint
                (__return_storage_ptr__,(ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8));
      return __return_storage_ptr__;
    }
    break;
  case 6:
    if ((ON_SubDFace *)(uVar1 & 0xfffffffffffffff8) != (ON_SubDFace *)0x0 && uVar3 == 6) {
      ON_SubDFace::SubdivisionPoint
                (__return_storage_ptr__,(ON_SubDFace *)(uVar1 & 0xfffffffffffffff8));
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  dVar2 = ON_3dPoint::NanPoint.y;
  __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
  __return_storage_ptr__->y = dVar2;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDComponentPtr::SubdivisionPoint() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  {
    const ON_SubDVertex* v = Vertex();
    if (nullptr != v)
      return v->SubdivisionPoint();
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  {
    const ON_SubDEdge* e = Edge();
    if (nullptr != e)
      return e->SubdivisionPoint();
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_FACE:
  {
    const ON_SubDFace* f = Face();
    if (nullptr != f)
      return f->SubdivisionPoint();
  }
  break;
  }
  return ON_3dPoint::NanPoint;
}